

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Unicode.cc
# Opt level: O2

void onmt::unicode::explode_utf8
               (string *str,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *chars,vector<int,_std::allocator<int>_> *code_points)

{
  code_point_t cVar1;
  size_t sVar2;
  pointer str_00;
  size_t local_50;
  code_point_t local_44;
  size_t local_40;
  char *local_38;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::reserve(chars,str->_M_string_length);
  std::vector<int,_std::allocator<int>_>::reserve(code_points,str->_M_string_length);
  for (str_00 = (str->_M_dataplus)._M_p; *str_00 != '\0'; str_00 = str_00 + sVar2) {
    local_50 = 0;
    cVar1 = utf8_to_cp(str_00,&local_50);
    sVar2 = 1;
    if (cVar1 != 0) {
      local_40 = local_50;
      local_44 = cVar1;
      local_38 = str_00;
      std::vector<int,_std::allocator<int>_>::push_back(code_points,&local_44);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const*&,unsigned_long&>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)chars,
                 &local_38,&local_40);
      sVar2 = local_50;
    }
  }
  return;
}

Assistant:

void explode_utf8(const std::string& str,
                      std::vector<std::string>& chars,
                      std::vector<code_point_t>& code_points)
    {
      chars.reserve(str.length());
      code_points.reserve(str.length());

      const auto callback = [&chars, &code_points](const char* data,
                                                   size_t length,
                                                   code_point_t code_point) {
        code_points.push_back(code_point);
        chars.emplace_back(data, length);
      };

      character_iterator(str, callback);
    }